

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathNamespaceURIFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlNodeSetPtr pxVar1;
  xmlNs *pxVar2;
  xmlXPathObjectPtr pxVar3;
  xmlXPathObjectPtr value;
  int iVar4;
  int iVar5;
  xmlChar *val;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs == 0) {
    pxVar3 = xmlXPathCacheNewNodeSet(ctxt,ctxt->context->node);
    xmlXPathValuePush(ctxt,pxVar3);
    nargs = 1;
  }
  if (nargs == 1) {
    iVar5 = ctxt->valueNr;
    if ((long)iVar5 < 1) {
      iVar5 = 0x17;
    }
    else {
      if ((ctxt->value != (xmlXPathObjectPtr)0x0) &&
         ((ctxt->value->type | XPATH_USERS) == XPATH_XSLT_TREE)) {
        iVar4 = iVar5 + -1;
        ctxt->valueNr = iVar4;
        if (iVar5 == 1) {
          pxVar3 = (xmlXPathObjectPtr)0x0;
        }
        else {
          pxVar3 = ctxt->valueTab[(long)iVar5 + -2];
        }
        ctxt->value = pxVar3;
        pxVar3 = ctxt->valueTab[iVar4];
        ctxt->valueTab[iVar4] = (xmlXPathObjectPtr)0x0;
        pxVar1 = pxVar3->nodesetval;
        if ((((pxVar1 == (xmlNodeSetPtr)0x0) || (pxVar1->nodeNr == 0)) ||
            (1 < (*pxVar1->nodeTab)->type - XML_ELEMENT_NODE)) ||
           (pxVar2 = (*pxVar1->nodeTab)->ns, pxVar2 == (xmlNs *)0x0)) {
          val = "";
        }
        else {
          val = pxVar2->href;
        }
        value = xmlXPathCacheNewString(ctxt,val);
        xmlXPathValuePush(ctxt,value);
        xmlXPathReleaseObject(ctxt->context,pxVar3);
        return;
      }
      iVar5 = 0xb;
    }
  }
  else {
    iVar5 = 0xc;
  }
  xmlXPathErr(ctxt,iVar5);
  return;
}

Assistant:

void
xmlXPathNamespaceURIFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr cur;

    if (ctxt == NULL) return;

    if (nargs == 0) {
	xmlXPathValuePush(ctxt, xmlXPathCacheNewNodeSet(ctxt, ctxt->context->node));
	nargs = 1;
    }
    CHECK_ARITY(1);
    if ((ctxt->value == NULL) ||
	((ctxt->value->type != XPATH_NODESET) &&
	 (ctxt->value->type != XPATH_XSLT_TREE)))
	XP_ERROR(XPATH_INVALID_TYPE);
    cur = xmlXPathValuePop(ctxt);

    if ((cur->nodesetval == NULL) || (cur->nodesetval->nodeNr == 0)) {
	xmlXPathValuePush(ctxt, xmlXPathCacheNewCString(ctxt, ""));
    } else {
	int i = 0; /* Should be first in document order !!!!! */
	switch (cur->nodesetval->nodeTab[i]->type) {
	case XML_ELEMENT_NODE:
	case XML_ATTRIBUTE_NODE:
	    if (cur->nodesetval->nodeTab[i]->ns == NULL)
		xmlXPathValuePush(ctxt, xmlXPathCacheNewCString(ctxt, ""));
	    else
		xmlXPathValuePush(ctxt, xmlXPathCacheNewString(ctxt,
			  cur->nodesetval->nodeTab[i]->ns->href));
	    break;
	default:
	    xmlXPathValuePush(ctxt, xmlXPathCacheNewCString(ctxt, ""));
	}
    }
    xmlXPathReleaseObject(ctxt->context, cur);
}